

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::BaseModeFunction<duckdb::ModeString>::
     Combine<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *source,
               ModeState<duckdb::string_t,_duckdb::ModeString> *target,AggregateInputData *param_3)

{
  bool bVar1;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *pOVar2;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> this;
  reference k;
  mapped_type *this_00;
  unsigned_long uVar3;
  long in_RSI;
  long in_RDI;
  mapped_type *i;
  pair<const_duckdb::string_t,_duckdb::ModeAttr> *val;
  iterator __end0;
  iterator __begin0;
  Counts *__range3;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *in_stack_ffffffffffffffa8;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true> local_38;
  undefined8 local_30;
  long local_10;
  long local_8;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (*(long *)(in_RSI + 0x18) == 0) {
      pOVar2 = (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                *)operator_new(0x48);
      OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
      ::OwningStringMap(in_stack_ffffffffffffffb0,pOVar2);
      *(OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
        **)(local_10 + 0x18) = pOVar2;
      *(undefined8 *)(local_10 + 0x38) = *(undefined8 *)(local_8 + 0x38);
    }
    else {
      local_30 = *(undefined8 *)(in_RDI + 0x18);
      local_38._M_cur =
           (__node_type *)
           OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::begin(in_stack_ffffffffffffffa8);
      this._M_cur = (__node_type *)
                    OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                    ::end(in_stack_ffffffffffffffa8);
      while (bVar1 = std::__detail::operator!=
                               (&local_38,
                                (_Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                                 *)&stack0xffffffffffffffc0), bVar1) {
        k = std::__detail::
            _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::
            operator*((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                       *)0xb33fbf);
        this_00 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                  ::operator[]((OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                                *)this._M_cur,&k->first);
        this_00->count = (k->second).count + this_00->count;
        uVar3 = MinValue<unsigned_long>(this_00->first_row,(k->second).first_row);
        this_00->first_row = uVar3;
        std::__detail::
        _Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>::operator++
                  ((_Node_iterator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_false,_true>
                    *)this_00);
      }
      *(long *)(local_10 + 0x38) = *(long *)(local_8 + 0x38) + *(long *)(local_10 + 0x38);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}